

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::GraphicsCacheTest::initPrograms
          (GraphicsCacheTest *this,SourceCollections *programCollection)

{
  uint uVar1;
  SourceCollections *this_00;
  deUint32 dVar2;
  VkShaderStageFlagBits VVar3;
  ProgramSources *pPVar4;
  allocator<char> local_281;
  string local_280;
  ShaderSource local_260;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  ShaderSource local_1e8;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  ShaderSource local_170;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  ShaderSource local_f8;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  ShaderSource local_80;
  allocator<char> local_41;
  string local_40;
  uint local_1c;
  SourceCollections *pSStack_18;
  deUint32 shaderNdx;
  SourceCollections *programCollection_local;
  GraphicsCacheTest *this_local;
  
  pSStack_18 = programCollection;
  programCollection_local = (SourceCollections *)this;
  for (local_1c = 0; uVar1 = local_1c,
      dVar2 = CacheTestParam::getShaderCount(&(this->super_CacheTest).m_param), uVar1 < dVar2;
      local_1c = local_1c + 1) {
    VVar3 = CacheTestParam::getShaderFlag(&(this->super_CacheTest).m_param,local_1c);
    this_00 = pSStack_18;
    switch(VVar3) {
    case VK_SHADER_STAGE_VERTEX_BIT:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"color_vert",&local_41)
      ;
      pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this_00->glslSources,&local_40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,
                 "#version 310 es\nlayout(location = 0) in vec4 position;\nlayout(location = 1) in vec4 color;\nlayout(location = 0) out highp vec4 vtxColor;\nvoid main (void)\n{\n  gl_Position = position;\n  vtxColor = color;\n}\n"
                 ,&local_a1);
      glu::VertexSource::VertexSource((VertexSource *)&local_80,&local_a0);
      glu::ProgramSources::operator<<(pPVar4,&local_80);
      glu::VertexSource::~VertexSource((VertexSource *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
      break;
    case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,"basic_tcs",&local_1b9);
      pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this_00->glslSources,&local_1b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,
                 "#version 450 \nlayout(vertices = 3) out;\nlayout(location = 0) in highp vec4 color[];\nlayout(location = 0) out highp vec4 vtxColor[];\nout gl_PerVertex { vec4 gl_Position; } gl_out[3];\nin gl_PerVertex { vec4 gl_Position; } gl_in[gl_MaxPatchVertices];\nvoid main()\n{\n  gl_TessLevelOuter[0] = 4.0;\n  gl_TessLevelOuter[1] = 4.0;\n  gl_TessLevelOuter[2] = 4.0;\n  gl_TessLevelInner[0] = 4.0;\n  gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n  vtxColor[gl_InvocationID] = color[gl_InvocationID];\n}\n"
                 ,&local_209);
      glu::TessellationControlSource::TessellationControlSource
                ((TessellationControlSource *)&local_1e8,&local_208);
      glu::ProgramSources::operator<<(pPVar4,&local_1e8);
      glu::TessellationControlSource::~TessellationControlSource
                ((TessellationControlSource *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator(&local_209);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      break;
    default:
      break;
    case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"basic_tes",&local_231);
      pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this_00->glslSources,&local_230);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,
                 "#version 450 \nlayout(triangles, fractional_even_spacing, ccw) in;\nlayout(location = 0) in highp vec4 colors[];\nlayout(location = 0) out highp vec4 vtxColor;\nout gl_PerVertex { vec4 gl_Position; };\nin gl_PerVertex { vec4 gl_Position; } gl_in[gl_MaxPatchVertices];\nvoid main() \n{\n  float u = gl_TessCoord.x;\n  float v = gl_TessCoord.y;\n  float w = gl_TessCoord.z;\n  vec4 pos = vec4(0);\n  vec4 color = vec4(0);\n  pos.xyz += u * gl_in[0].gl_Position.xyz;\n  color.xyz += u * colors[0].xyz;\n  pos.xyz += v * gl_in[1].gl_Position.xyz;\n  color.xyz += v * colors[1].xyz;\n  pos.xyz += w * gl_in[2].gl_Position.xyz;\n  color.xyz += w * colors[2].xyz;\n  pos.w = 1.0;\n  color.w = 1.0;\n  gl_Position = pos;\n  vtxColor = color;\n}\n"
                 ,&local_281);
      glu::TessellationEvaluationSource::TessellationEvaluationSource
                ((TessellationEvaluationSource *)&local_260,&local_280);
      glu::ProgramSources::operator<<(pPVar4,&local_260);
      glu::TessellationEvaluationSource::~TessellationEvaluationSource
                ((TessellationEvaluationSource *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator(&local_281);
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator(&local_231);
      break;
    case VK_SHADER_STAGE_GEOMETRY_BIT:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"dummy_geo",&local_141);
      pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this_00->glslSources,&local_140);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,
                 "#version 450 \nlayout(triangles) in;\nlayout(triangle_strip, max_vertices = 3) out;\nlayout(location = 0) in highp vec4 in_vtxColor[];\nlayout(location = 0) out highp vec4 vtxColor;\nout gl_PerVertex { vec4 gl_Position; };\nin gl_PerVertex { vec4 gl_Position; } gl_in[];\nvoid main (void)\n{\n  for(int ndx=0; ndx<3; ndx++)\n  {\n    gl_Position = gl_in[ndx].gl_Position;\n    vtxColor    = in_vtxColor[ndx];\n    EmitVertex();\n  }\n  EndPrimitive();\n}\n"
                 ,&local_191);
      glu::GeometrySource::GeometrySource((GeometrySource *)&local_170,&local_190);
      glu::ProgramSources::operator<<(pPVar4,&local_170);
      glu::GeometrySource::~GeometrySource((GeometrySource *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator(&local_191);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
      break;
    case VK_SHADER_STAGE_FRAGMENT_BIT:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"color_frag",&local_c9)
      ;
      pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this_00->glslSources,&local_c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,
                 "#version 310 es\nlayout(location = 0) in highp vec4 vtxColor;\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n  fragColor = vtxColor;\n}\n"
                 ,&local_119);
      glu::FragmentSource::FragmentSource((FragmentSource *)&local_f8,&local_118);
      glu::ProgramSources::operator<<(pPVar4,&local_f8);
      glu::FragmentSource::~FragmentSource((FragmentSource *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
    }
  }
  return;
}

Assistant:

void GraphicsCacheTest::initPrograms (SourceCollections& programCollection) const
{
	for (deUint32 shaderNdx = 0; shaderNdx < m_param.getShaderCount(); shaderNdx++)
	{
		switch(m_param.getShaderFlag(shaderNdx))
		{
			case VK_SHADER_STAGE_VERTEX_BIT:
				programCollection.glslSources.add("color_vert") << glu::VertexSource(
					"#version 310 es\n"
					"layout(location = 0) in vec4 position;\n"
					"layout(location = 1) in vec4 color;\n"
					"layout(location = 0) out highp vec4 vtxColor;\n"
					"void main (void)\n"
					"{\n"
					"  gl_Position = position;\n"
					"  vtxColor = color;\n"
					"}\n");
				break;

			case VK_SHADER_STAGE_FRAGMENT_BIT:
				programCollection.glslSources.add("color_frag") << glu::FragmentSource(
					"#version 310 es\n"
					"layout(location = 0) in highp vec4 vtxColor;\n"
					"layout(location = 0) out highp vec4 fragColor;\n"
					"void main (void)\n"
					"{\n"
					"  fragColor = vtxColor;\n"
					"}\n");
				break;

			case VK_SHADER_STAGE_GEOMETRY_BIT:
				programCollection.glslSources.add("dummy_geo") << glu::GeometrySource(
					"#version 450 \n"
					"layout(triangles) in;\n"
					"layout(triangle_strip, max_vertices = 3) out;\n"
					"layout(location = 0) in highp vec4 in_vtxColor[];\n"
					"layout(location = 0) out highp vec4 vtxColor;\n"
					"out gl_PerVertex { vec4 gl_Position; };\n"
					"in gl_PerVertex { vec4 gl_Position; } gl_in[];\n"
					"void main (void)\n"
					"{\n"
					"  for(int ndx=0; ndx<3; ndx++)\n"
					"  {\n"
					"    gl_Position = gl_in[ndx].gl_Position;\n"
					"    vtxColor    = in_vtxColor[ndx];\n"
					"    EmitVertex();\n"
					"  }\n"
					"  EndPrimitive();\n"
					"}\n");
				break;

			case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
				programCollection.glslSources.add("basic_tcs") << glu::TessellationControlSource(
					"#version 450 \n"
					"layout(vertices = 3) out;\n"
					"layout(location = 0) in highp vec4 color[];\n"
					"layout(location = 0) out highp vec4 vtxColor[];\n"
					"out gl_PerVertex { vec4 gl_Position; } gl_out[3];\n"
					"in gl_PerVertex { vec4 gl_Position; } gl_in[gl_MaxPatchVertices];\n"
					"void main()\n"
					"{\n"
					"  gl_TessLevelOuter[0] = 4.0;\n"
					"  gl_TessLevelOuter[1] = 4.0;\n"
					"  gl_TessLevelOuter[2] = 4.0;\n"
					"  gl_TessLevelInner[0] = 4.0;\n"
					"  gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
					"  vtxColor[gl_InvocationID] = color[gl_InvocationID];\n"
					"}\n");
				break;

			case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
				programCollection.glslSources.add("basic_tes") << glu::TessellationEvaluationSource(
					"#version 450 \n"
					"layout(triangles, fractional_even_spacing, ccw) in;\n"
					"layout(location = 0) in highp vec4 colors[];\n"
					"layout(location = 0) out highp vec4 vtxColor;\n"
					"out gl_PerVertex { vec4 gl_Position; };\n"
					"in gl_PerVertex { vec4 gl_Position; } gl_in[gl_MaxPatchVertices];\n"
					"void main() \n"
					"{\n"
					"  float u = gl_TessCoord.x;\n"
					"  float v = gl_TessCoord.y;\n"
					"  float w = gl_TessCoord.z;\n"
					"  vec4 pos = vec4(0);\n"
					"  vec4 color = vec4(0);\n"
					"  pos.xyz += u * gl_in[0].gl_Position.xyz;\n"
					"  color.xyz += u * colors[0].xyz;\n"
					"  pos.xyz += v * gl_in[1].gl_Position.xyz;\n"
					"  color.xyz += v * colors[1].xyz;\n"
					"  pos.xyz += w * gl_in[2].gl_Position.xyz;\n"
					"  color.xyz += w * colors[2].xyz;\n"
					"  pos.w = 1.0;\n"
					"  color.w = 1.0;\n"
					"  gl_Position = pos;\n"
					"  vtxColor = color;\n"
					"}\n");
				break;

			default:
				DE_FATAL("Unknown Shader Stage!");
				break;
		};
	}
}